

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<const_kj::File,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::createTemporary(DiskDirectory *this)

{
  PathPtr finalName;
  size_t sVar1;
  Iface *pIVar2;
  String *pSVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  File *extraout_RDX_03;
  File *extraout_RDX_04;
  File *pFVar7;
  int iVar8;
  long in_RSI;
  char *pcVar9;
  DiskHandle *this_00;
  Own<const_kj::File,_std::nullptr_t> OVar10;
  StringPtr name;
  int newFd_;
  OwnFd newFd;
  String temp;
  Fault f;
  int local_98;
  OwnFd local_94;
  OwnFd local_90;
  OwnFd local_8c;
  String local_88;
  Function<int_(kj::StringPtr)> local_68;
  Path local_58;
  Fault local_38;
  
  this_00 = (DiskHandle *)(in_RSI + 8);
  do {
    lVar5 = syscall(0x101,(ulong)(uint)(this_00->fd).fd,".",0x410002,0x1c0);
    local_98 = (int)lVar5;
    if (-1 < local_98) {
      iVar4 = 0;
      pFVar7 = extraout_RDX;
      break;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
    pFVar7 = extraout_RDX_00;
  } while (iVar4 == -1);
  iVar8 = local_98;
  if (iVar4 == 0) {
    local_8c.fd = local_98;
    local_88.content.ptr = (char *)CONCAT44(local_88.content.ptr._4_4_,0xffffffff);
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = &PTR_getFd_0070f9f8;
    *(int *)(puVar6 + 1) = iVar8;
    local_8c.fd = -1;
    *puVar6 = &PTR_getFd_00710578;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
    *(undefined8 **)&this->super_DiskHandle = puVar6;
    OwnFd::~OwnFd(&local_8c);
    OwnFd::~OwnFd((OwnFd *)&local_88);
    pFVar7 = extraout_RDX_02;
  }
  else if ((1 < iVar4 - 0x15U) && (iVar4 != 0x5f)) {
    local_58.parts.ptr = (String *)0x0;
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_58);
    pFVar7 = extraout_RDX_01;
  }
  if (iVar4 != 0) {
    name.content.size_ = 8;
    name.content.ptr = "unnamed";
    Path::Path(&local_58,name);
    finalName.parts.size_ = local_58.parts.size_;
    finalName.parts.ptr = local_58.parts.ptr;
    local_68.impl.ptr = (Iface *)operator_new(0x18);
    (local_68.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00710a08;
    local_68.impl.ptr[1]._vptr_Iface = (_func_int **)&local_98;
    local_68.impl.ptr[2]._vptr_Iface = (_func_int **)this_00;
    local_68.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::createTemporary()const::{lambda(kj::StringPtr)#1}>>
          ::instance;
    DiskHandle::createNamedTemporary(&local_88,this_00,finalName,CREATE,&local_68);
    pIVar2 = local_68.impl.ptr;
    if (local_68.impl.ptr != (Iface *)0x0) {
      local_68.impl.ptr = (Iface *)0x0;
      (**(local_68.impl.disposer)->_vptr_Disposer)
                (local_68.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
    }
    sVar1 = local_58.parts.size_;
    pSVar3 = local_58.parts.ptr;
    if (local_58.parts.ptr != (String *)0x0) {
      local_58.parts.ptr = (String *)0x0;
      local_58.parts.size_ = 0;
      (**(local_58.parts.disposer)->_vptr_ArrayDisposer)
                (local_58.parts.disposer,pSVar3,0x18,sVar1,sVar1,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
    }
    iVar4 = local_98;
    local_94.fd = local_98;
    local_90.fd = -1;
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = &PTR_getFd_0070f9f8;
    *(int *)(puVar6 + 1) = iVar4;
    local_94.fd = -1;
    *puVar6 = &PTR_getFd_00710578;
    OwnFd::~OwnFd(&local_94);
    do {
      pcVar9 = "";
      if (local_88.content.size_ != 0) {
        pcVar9 = local_88.content.ptr;
      }
      iVar8 = 0;
      iVar4 = unlinkat((this_00->fd).fd,pcVar9,0);
    } while ((iVar4 < 0) && (iVar8 = kj::_::Debug::getOsErrorNumber(false), iVar8 == -1));
    if (iVar8 != 0) {
      local_38.exception = (Exception *)0x0;
      local_58.parts.ptr = (String *)0x0;
      local_58.parts.size_ = 0;
      kj::_::Debug::Fault::init
                (&local_38,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault(&local_38);
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
    *(undefined8 **)&this->super_DiskHandle = puVar6;
    OwnFd::~OwnFd(&local_90);
    sVar1 = local_88.content.size_;
    pcVar9 = local_88.content.ptr;
    pFVar7 = extraout_RDX_03;
    if (local_88.content.ptr != (char *)0x0) {
      local_88.content.ptr = (char *)0x0;
      local_88.content.size_ = 0;
      (**(local_88.content.disposer)->_vptr_ArrayDisposer)
                (local_88.content.disposer,pcVar9,1,sVar1,sVar1,0);
      pFVar7 = extraout_RDX_04;
    }
  }
  OVar10.ptr = pFVar7;
  OVar10.disposer = (Disposer *)this;
  return OVar10;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }